

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MarkContext.h
# Opt level: O1

bool __thiscall Memory::MarkContext::IsEmpty(MarkContext *this)

{
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  undefined4 *puVar4;
  
  bVar2 = PageStack<Memory::MarkContext::MarkCandidate>::IsEmpty(&this->markStack);
  bVar3 = true;
  if (bVar2) {
    bVar3 = PageStack<FinalizableObject_*>::IsEmpty(&this->trackStack);
    bVar3 = !bVar3;
  }
  if (bVar3 == false) {
    if (this->pagePool->freePageList != (PagePoolFreePage *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/MarkContext.h"
                         ,0x59,"(pagePool->IsEmpty())","pagePool->IsEmpty()");
      if (!bVar2) goto LAB_00725361;
      *puVar4 = 0;
    }
    if ((this->pagePool->pageAllocator).disableAllocationOutOfMemory == true) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/MarkContext.h"
                         ,0x5a,"(!GetPageAllocator()->DisableAllocationOutOfMemory())",
                         "!GetPageAllocator()->DisableAllocationOutOfMemory()");
      if (!bVar2) {
LAB_00725361:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
    }
  }
  return (bool)(bVar3 ^ 1);
}

Assistant:

bool IsEmpty()
    {
        if (HasPendingObjects())
        {
            return false;
        }

        Assert(pagePool->IsEmpty());
        Assert(!GetPageAllocator()->DisableAllocationOutOfMemory());
        return true;
    }